

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O3

block * gen_broadcast(compiler_state_t *cstate,int proto)

{
  int iVar1;
  block *pbVar2;
  block *b0;
  block *b1;
  u_int size;
  ulong uVar3;
  u_int offset;
  char *pcVar4;
  uint mask;
  
  if (1 < (uint)proto) {
    if (proto != 2) {
      pcVar4 = "only link-layer/IP broadcast filters supported";
      goto LAB_0010f99d;
    }
    if (cstate->netmask == 0xffffffff) {
      pcVar4 = "netmask not known, so \'ip broadcast\' not supported";
      goto LAB_0010f99d;
    }
    b0 = gen_linktype(cstate,0x800);
    mask = ~cstate->netmask;
    pbVar2 = gen_ncmp(cstate,OR_LINKPL,0x10,0,mask,0x10,0,0);
    b1 = gen_ncmp(cstate,OR_LINKPL,0x10,0,mask,0x10,0,mask);
    gen_or(pbVar2,b1);
    goto LAB_0010f93a;
  }
  iVar1 = cstate->linktype;
  if (0x68 < iVar1) {
    uVar3 = (ulong)(iVar1 - 0x69U);
    if (iVar1 - 0x69U < 0x3b) {
      if ((0x400000000404001U >> (uVar3 & 0x3f) & 1) != 0) goto LAB_0010f7f6;
      if (uVar3 == 0x11) goto switchD_0010f8bc_caseD_6;
      if (uVar3 == 0x18) goto switchD_0010f8bc_caseD_7;
    }
    if (1 < iVar1 - 0xf0U) {
      if (iVar1 == 0xc0) {
LAB_0010f7f6:
        pbVar2 = gen_wlanhostop(cstate,gen_broadcast::ebroadcast,2);
        return pbVar2;
      }
switchD_0010f8bc_caseD_2:
      pcVar4 = "not a broadcast link";
LAB_0010f99d:
      bpf_error(cstate,pcVar4);
    }
switchD_0010f8bc_caseD_1:
    b0 = gen_prevlinkhdr_check(cstate);
    b1 = gen_bcmp(cstate,OR_LINKHDR,0,6,gen_broadcast::ebroadcast);
    if (b0 == (block *)0x0) {
      return b1;
    }
LAB_0010f93a:
    gen_and(b0,b1);
    return b1;
  }
  switch(iVar1) {
  case 1:
    goto switchD_0010f8bc_caseD_1;
  default:
    goto switchD_0010f8bc_caseD_2;
  case 6:
switchD_0010f8bc_caseD_6:
    offset = 2;
    break;
  case 7:
switchD_0010f8bc_caseD_7:
    pcVar4 = "";
    offset = 1;
    size = 1;
    goto LAB_0010f96b;
  case 10:
    offset = cstate->pcap_fddipad + 1;
  }
  size = 6;
  pcVar4 = (char *)gen_broadcast::ebroadcast;
LAB_0010f96b:
  pbVar2 = gen_bcmp(cstate,OR_LINKHDR,offset,size,(u_char *)pcVar4);
  return pbVar2;
}

Assistant:

struct block *
gen_broadcast(compiler_state_t *cstate, int proto)
{
	bpf_u_int32 hostmask;
	struct block *b0, *b1, *b2;
	static const u_char ebroadcast[] = { 0xff, 0xff, 0xff, 0xff, 0xff, 0xff };

	switch (proto) {

	case Q_DEFAULT:
	case Q_LINK:
		switch (cstate->linktype) {
		case DLT_ARCNET:
		case DLT_ARCNET_LINUX:
			return gen_ahostop(cstate, abroadcast, Q_DST);
		case DLT_EN10MB:
		case DLT_NETANALYZER:
		case DLT_NETANALYZER_TRANSPARENT:
			b1 = gen_prevlinkhdr_check(cstate);
			b0 = gen_ehostop(cstate, ebroadcast, Q_DST);
			if (b1 != NULL)
				gen_and(b1, b0);
			return b0;
		case DLT_FDDI:
			return gen_fhostop(cstate, ebroadcast, Q_DST);
		case DLT_IEEE802:
			return gen_thostop(cstate, ebroadcast, Q_DST);
		case DLT_IEEE802_11:
		case DLT_PRISM_HEADER:
		case DLT_IEEE802_11_RADIO_AVS:
		case DLT_IEEE802_11_RADIO:
		case DLT_PPI:
			return gen_wlanhostop(cstate, ebroadcast, Q_DST);
		case DLT_IP_OVER_FC:
			return gen_ipfchostop(cstate, ebroadcast, Q_DST);
		default:
			bpf_error(cstate, "not a broadcast link");
		}
		break;

	case Q_IP:
		/*
		 * We treat a netmask of PCAP_NETMASK_UNKNOWN (0xffffffff)
		 * as an indication that we don't know the netmask, and fail
		 * in that case.
		 */
		if (cstate->netmask == PCAP_NETMASK_UNKNOWN)
			bpf_error(cstate, "netmask not known, so 'ip broadcast' not supported");
		b0 = gen_linktype(cstate, ETHERTYPE_IP);
		hostmask = ~cstate->netmask;
		b1 = gen_mcmp(cstate, OR_LINKPL, 16, BPF_W, (bpf_int32)0, hostmask);
		b2 = gen_mcmp(cstate, OR_LINKPL, 16, BPF_W,
			      (bpf_int32)(~0 & hostmask), hostmask);
		gen_or(b1, b2);
		gen_and(b0, b2);
		return b2;
	}
	bpf_error(cstate, "only link-layer/IP broadcast filters supported");
	/* NOTREACHED */
	return NULL;
}